

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

void __thiscall Executor::visit(Executor *this,ProgramNode *node)

{
  Context *this_00;
  _List_node_base *p_Var1;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar2;
  RuntimeFunctionAnalyser functionAnalyser;
  NumberValueAnalyser valueAnalyser;
  undefined1 local_88 [24];
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  local_70;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined **local_48;
  undefined1 local_40;
  double local_38;
  char local_30;
  
  for (p_Var1 = (node->variables_).
                super__List_base<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&node->variables_; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x10))(p_Var1[1]._M_next,this);
  }
  for (p_Var1 = (node->functions_).
                super__List_base<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&node->functions_; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x10))(p_Var1[1]._M_next,this);
  }
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"main","");
  this_00 = &this->context_;
  oVar2 = Context::lookup(this_00,(string *)local_88,0);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  RuntimeFunctionAnalyser::RuntimeFunctionAnalyser((RuntimeFunctionAnalyser *)local_88);
  if (((undefined1  [16])
       oVar2.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_> & (undefined1  [16])0x1)
      != (undefined1  [16])0x0) {
    (**(code **)(*(long *)oVar2.
                          super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>.
                          _M_payload.
                          super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>.
                          _M_payload + 0x10))
              (oVar2.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>.
               _M_payload.super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>.
               _M_payload,local_88);
    Context::enterScope(this_00);
    (*(local_58->super_StatementNode).super_Node._vptr_Node[2])(local_58,this);
    Context::leaveScope(this_00);
    local_48 = &PTR__ValueVisitor_001ea2b8;
    local_40 = 0;
    local_30 = '\0';
    (*((this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
       super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
       super__Head_base<0UL,_Value_*,_false>._M_head_impl)->_vptr_Value[3])();
    if (local_30 != '\0') {
      this->exitCode_ = (int)local_38;
      local_88._0_8_ = &PTR__RuntimeFunctionAnalyser_001e9798;
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      std::__cxx11::
      _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
      ::_M_clear(&local_70);
      return;
    }
    std::__throw_bad_optional_access();
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::visit(const ProgramNode& node)
{
  for(const auto& variable : node.getVariables())
    variable->accept(*this);

  for(const auto& function : node.getFunctions())
    function->accept(*this);

  const auto mainSymbol = context_.lookup("main");
  auto functionAnalyser = RuntimeFunctionAnalyser{};
  mainSymbol.value().get().accept(functionAnalyser);

  context_.enterScope();
  functionAnalyser.getBody()->accept(*this);
  context_.leaveScope();

  auto valueAnalyser = NumberValueAnalyser{};
  value_->accept(valueAnalyser);
  exitCode_ = valueAnalyser.getValue().value();
}